

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Image.c
# Opt level: O0

int Llb_NonlinStart(Llb_Mgr_t *p)

{
  int iVar1;
  Vec_Ptr_t *p_00;
  DdNode *bFunc_00;
  int local_2c;
  int i;
  DdNode *bFunc;
  Vec_Ptr_t *vRootBdds;
  Llb_Mgr_t *p_local;
  
  p_00 = Llb_NonlinBuildBdds(p->pAig,p->vLeaves,p->vRoots,p->dd);
  if (p_00 == (Vec_Ptr_t *)0x0) {
    p_local._4_4_ = 0;
  }
  else {
    for (local_2c = 0; iVar1 = Vec_PtrSize(p_00), local_2c < iVar1; local_2c = local_2c + 1) {
      bFunc_00 = (DdNode *)Vec_PtrEntry(p_00,local_2c);
      Llb_NonlinAddPartition(p,local_2c,bFunc_00);
    }
    Vec_PtrFree(p_00);
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

int Llb_NonlinStart( Llb_Mgr_t * p )
{
    Vec_Ptr_t * vRootBdds;
    DdNode * bFunc;
    int i;
    // create and collect BDDs
    vRootBdds = Llb_NonlinBuildBdds( p->pAig, p->vLeaves, p->vRoots, p->dd ); // come referenced
    if ( vRootBdds == NULL )
        return 0;
    // add pairs (refs are consumed inside)
    Vec_PtrForEachEntry( DdNode *, vRootBdds, bFunc, i )
        Llb_NonlinAddPartition( p, i, bFunc );
    Vec_PtrFree( vRootBdds );
    return 1;
}